

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::~SimInfo(SimInfo *this)

{
  long *plVar1;
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  *in_RDI;
  LocalIndexManager *this_00;
  
  *(undefined ***)&(in_RDI->_M_t)._M_impl = &PTR__SimInfo_004fff48;
  Utils::
  deletePointers<std::map<int,OpenMD::Molecule*,std::less<int>,std::allocator<std::pair<int_const,OpenMD::Molecule*>>>>
            (in_RDI);
  plVar1 = (long *)in_RDI[0xf]._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  this_00 = (LocalIndexManager *)(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (this_00 != (LocalIndexManager *)0x0) {
    (**(code **)(*(long *)&this_00->atomIndexContainer_ + 8))();
  }
  plVar1 = *(long **)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)in_RDI);
  std::__cxx11::string::~string
            ((string *)&in_RDI[0x18]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::__cxx11::string::~string
            ((string *)&in_RDI[0x17]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  std::__cxx11::string::~string((string *)(in_RDI + 0x17));
  std::__cxx11::string::~string
            ((string *)&in_RDI[0x16]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::__cxx11::string::~string
            ((string *)&in_RDI[0x15]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  std::__cxx11::string::~string((string *)(in_RDI + 0x15));
  LocalIndexManager::~LocalIndexManager(this_00);
  PropertyMap::~PropertyMap((PropertyMap *)0x14ff03);
  PairList::~PairList((PairList *)this_00);
  PairList::~PairList((PairList *)this_00);
  PairList::~PairList((PairList *)this_00);
  PairList::~PairList((PairList *)this_00);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  std::vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_>::~vector
            ((vector<OpenMD::MoleculeStamp_*,_std::allocator<OpenMD::MoleculeStamp_*>_> *)in_RDI);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  std::
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  ::~map((map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
          *)0x14ffcf);
  std::shared_ptr<OpenMD::Utils::RandNumGen>::~shared_ptr
            ((shared_ptr<OpenMD::Utils::RandNumGen> *)0x14ffdd);
  return;
}

Assistant:

SimInfo::~SimInfo() {
    Utils::deletePointers(molecules_);

    delete sman_;
    delete simParams_;
    delete forceField_;
  }